

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Source.cpp
# Opt level: O1

int __thiscall
helics::apps::Source::addSignalGenerator(Source *this,string_view name,string_view type)

{
  pointer psVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  int iVar2;
  size_t sVar3;
  char *__s1;
  size_type __rlen;
  int index;
  undefined1 local_49;
  PhasorGenerator *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  shared_ptr<helics::apps::SignalGenerator> local_38;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  
  __s1 = type._M_str;
  sVar3 = type._M_len;
  local_28._M_str = name._M_str;
  local_28._M_len = name._M_len;
  local_38.super___shared_ptr<helics::apps::SignalGenerator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_38.super___shared_ptr<helics::apps::SignalGenerator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (sVar3 == 10) {
    local_38.super___shared_ptr<helics::apps::SignalGenerator,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_38.super___shared_ptr<helics::apps::SignalGenerator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    iVar2 = bcmp(__s1,"oscillator",10);
joined_r0x001dfeba:
    if (iVar2 != 0) goto LAB_001dff50;
    local_48 = (PhasorGenerator *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<helics::apps::PhasorGenerator,std::allocator<helics::apps::PhasorGenerator>,std::basic_string_view<char,std::char_traits<char>>&>
              (&_Stack_40,&local_48,(allocator<helics::apps::PhasorGenerator> *)&local_49,&local_28)
    ;
  }
  else {
    if (sVar3 == 6) {
      local_38.super___shared_ptr<helics::apps::SignalGenerator,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_38.super___shared_ptr<helics::apps::SignalGenerator,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)0x0;
      iVar2 = bcmp(__s1,"phasor",6);
      goto joined_r0x001dfeba;
    }
    if (sVar3 != 4) goto LAB_001dff50;
    iVar2 = bcmp(__s1,"sine",4);
    if (iVar2 == 0) {
      local_48 = (PhasorGenerator *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<helics::apps::SineGenerator,std::allocator<helics::apps::SineGenerator>,std::basic_string_view<char,std::char_traits<char>>&>
                (&_Stack_40,(SineGenerator **)&local_48,
                 (allocator<helics::apps::SineGenerator> *)&local_49,&local_28);
    }
    else {
      iVar2 = bcmp(__s1,"ramp",4);
      if (iVar2 != 0) goto LAB_001dff50;
      local_48 = (PhasorGenerator *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<helics::apps::RampGenerator,std::allocator<helics::apps::RampGenerator>,std::basic_string_view<char,std::char_traits<char>>&>
                (&_Stack_40,(RampGenerator **)&local_48,
                 (allocator<helics::apps::RampGenerator> *)&local_49,&local_28);
    }
  }
  this_00._M_pi =
       local_38.super___shared_ptr<helics::apps::SignalGenerator,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  local_38.super___shared_ptr<helics::apps::SignalGenerator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_40._M_pi;
  local_38.super___shared_ptr<helics::apps::SignalGenerator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_48->super_SignalGenerator;
  local_48 = (PhasorGenerator *)0x0;
  _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
  }
  if (_Stack_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_40._M_pi);
  }
LAB_001dff50:
  std::
  vector<std::shared_ptr<helics::apps::SignalGenerator>,std::allocator<std::shared_ptr<helics::apps::SignalGenerator>>>
  ::emplace_back<std::shared_ptr<helics::apps::SignalGenerator>>
            ((vector<std::shared_ptr<helics::apps::SignalGenerator>,std::allocator<std::shared_ptr<helics::apps::SignalGenerator>>>
              *)&this->generators,&local_38);
  psVar1 = (this->generators).
           super__Vector_base<std::shared_ptr<helics::apps::SignalGenerator>,_std::allocator<std::shared_ptr<helics::apps::SignalGenerator>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_48 = (PhasorGenerator *)
             CONCAT44(local_48._4_4_,
                      (int)((ulong)((long)psVar1 -
                                   (long)(this->generators).
                                         super__Vector_base<std::shared_ptr<helics::apps::SignalGenerator>,_std::allocator<std::shared_ptr<helics::apps::SignalGenerator>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 4) + -1);
  std::
  _Rb_tree<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,int>,std::_Select1st<std::pair<std::basic_string_view<char,std::char_traits<char>>const,int>>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,int>>>
  ::_M_emplace_unique<std::__cxx11::string_const&,int&>
            ((_Rb_tree<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,int>,std::_Select1st<std::pair<std::basic_string_view<char,std::char_traits<char>>const,int>>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,int>>>
              *)&this->generatorLookup,
             &(psVar1[-1].
               super___shared_ptr<helics::apps::SignalGenerator,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->mName,(int *)&local_48);
  iVar2 = (int)local_48;
  if (local_38.super___shared_ptr<helics::apps::SignalGenerator,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.
               super___shared_ptr<helics::apps::SignalGenerator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return iVar2;
}

Assistant:

int Source::addSignalGenerator(std::string_view name, std::string_view type)
    {
        std::shared_ptr<SignalGenerator> gen;
        if (type == "sine") {
            gen = std::make_shared<SineGenerator>(name);
        } else if (type == "ramp") {
            gen = std::make_shared<RampGenerator>(name);
        } else if ((type == "oscillator") || (type == "phasor")) {
            gen = std::make_shared<PhasorGenerator>(name);
        }
        generators.push_back(std::move(gen));
        auto index = static_cast<int>(generators.size() - 1);
        generatorLookup.emplace(generators.back()->getName(), index);
        return index;
    }